

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

Status __thiscall
leveldb::log::LogTest::StringSource::Read(StringSource *this,size_t n,Slice *result,char *scratch)

{
  Tester *this_00;
  Slice local_1d8;
  Tester local_1c8;
  
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0xb4);
  this_00 = test::Tester::Is(&local_1c8,(bool)(*(byte *)(n + 0x19) ^ 1),"!returned_partial_");
  test::Tester::operator<<(this_00,(char (*) [32])"must not Read() after eof/error");
  test::Tester::~Tester(&local_1c8);
  if (*(char *)(n + 0x18) == '\x01') {
    *(undefined2 *)(n + 0x18) = 0x100;
    local_1c8._0_8_ = "read error";
    local_1c8.fname_ = (char *)0xa;
    local_1d8.data_ = "";
    local_1d8.size_ = 0;
    Status::Corruption((Status *)this,(Slice *)&local_1c8,&local_1d8);
  }
  else {
    if (*(Slice **)(n + 0x10) < result) {
      *(undefined1 *)(n + 0x19) = 1;
      result = *(Slice **)(n + 0x10);
    }
    *(char **)scratch = ((Slice *)(n + 8))->data_;
    *(Slice **)(scratch + 8) = result;
    Slice::remove_prefix((Slice *)(n + 8),(size_t)result);
    (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
      ASSERT_TRUE(!returned_partial_) << "must not Read() after eof/error";

      if (force_error_) {
        force_error_ = false;
        returned_partial_ = true;
        return Status::Corruption("read error");
      }

      if (contents_.size() < n) {
        n = contents_.size();
        returned_partial_ = true;
      }
      *result = Slice(contents_.data(), n);
      contents_.remove_prefix(n);
      return Status::OK();
    }